

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkSubpassDependency * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSubpassDependency>
          (Impl *this,VkSubpassDependency *src,size_t count,ScratchAllocator *alloc)

{
  VkSubpassDependency *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkSubpassDependency>(alloc,count);
    if (pVVar1 != (VkSubpassDependency *)0x0) {
      pVVar1 = (VkSubpassDependency *)memmove(pVVar1,src,count * 0x1c);
      return pVVar1;
    }
  }
  return (VkSubpassDependency *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}